

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O2

void inimenu(void)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  char unaff_R12B;
  int iVar4;
  char a;
  string s;
  stringstream ss;
  ostream local_3b0 [376];
  ifstream fin;
  
  std::ifstream::ifstream(&fin,"menu.txt",_S_in);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  lVar2 = 0;
LAB_001026fe:
  if (lVar2 == 5) {
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::__cxx11::string::~string((string *)&s);
    std::ifstream::~ifstream(&fin);
    return;
  }
  std::__cxx11::string::erase((ulong)&s,0);
  iVar4 = 0;
  do {
LAB_00102758:
    plVar1 = (long *)std::istream::get((char *)&fin);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) goto LAB_00102883;
    if ((9 < (byte)(a - 0x30U)) && (0x19 < (byte)((a & 0xdfU) + 0xbf))) break;
    std::__cxx11::string::push_back((char)&s);
    unaff_R12B = a;
  } while( true );
  if ((a != ' ') && (a != '\n')) goto LAB_00102758;
  switch(iVar4) {
  case 0:
    std::__cxx11::string::_M_assign((string *)(ITEM + lVar2));
    break;
  case 1:
    ITEM[lVar2].price = (double)(unaff_R12B + -0x30);
    break;
  case 2:
    std::operator<<(local_3b0,(string *)&s);
    piVar3 = &ITEM[lVar2].amount;
    goto LAB_001027f5;
  case 3:
    std::operator<<(local_3b0,(string *)&s);
    piVar3 = &ITEM[lVar2].manu;
LAB_001027f5:
    std::istream::operator>>((istream *)&ss,piVar3);
    break;
  case 4:
    std::operator<<(local_3b0,(string *)&s);
    std::istream::operator>>((istream *)&ss,&ITEM[lVar2].span);
LAB_00102883:
    lVar2 = lVar2 + 1;
    goto LAB_001026fe;
  default:
    if (3 < iVar4) goto LAB_00102883;
  }
  std::__cxx11::string::erase((ulong)&s,0);
  iVar4 = iVar4 + 1;
  std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + (int)&ss);
  goto LAB_00102758;
}

Assistant:

void inimenu() {
    ifstream fin("menu.txt");
    char a, b;
    string s;
    stringstream ss;
    int i, j;

    for (i = 0; i < number; i++) {
        j = 0;
        s.erase(0);
        while (fin.get(a)) {
            if ((a >= 'a' && a <= 'z') || (a >= 'A' && a <= 'Z') || (a >= '0' && a <= '9')) {
                s += a;
                b = a;
            } else if (a == ' ' || a == '\n') {
                switch (j) {
                    case 0:
                        ITEM[i].name = s;
                        break;
                    case 1:
                        ITEM[i].price = b - '0';
                        break;
                    case 2:
                        ss << s;
                        ss >> ITEM[i].amount;
                        break;
                    case 3:
                        ss << s;
                        ss >> ITEM[i].manu;
                        break;
                    case 4:
                        ss << s;
                        ss >> ITEM[i].span;
                }
                j++;
                if (j > 4) {
                    break;
                }

                s.erase(0);
                ss.clear();
            }
        }
    }
    fin.close();
}